

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

void LzmaDec_WriteRem(CLzmaDec *p,SizeT limit)

{
  uint uVar1;
  Byte *pBVar2;
  SizeT SVar3;
  SizeT local_58;
  SizeT rem;
  SizeT rep0;
  uint len;
  SizeT dicBufSize;
  SizeT dicPos;
  Byte *dic;
  SizeT limit_local;
  CLzmaDec *p_local;
  
  if ((p->remainLen != 0) && (p->remainLen < 0x112)) {
    pBVar2 = p->dic;
    dicPos = p->dicPos;
    SVar3 = p->dicBufSize;
    len = p->remainLen;
    uVar1 = p->reps[0];
    if (limit - dicPos < (ulong)len) {
      len = (uint)(limit - dicPos);
    }
    if ((p->checkDicSize == 0) && ((p->prop).dicSize - p->processedPos <= len)) {
      p->checkDicSize = (p->prop).dicSize;
    }
    p->processedPos = len + p->processedPos;
    p->remainLen = p->remainLen - len;
    while (len != 0) {
      len = len - 1;
      local_58 = SVar3;
      if (uVar1 <= dicPos) {
        local_58 = 0;
      }
      pBVar2[dicPos] = pBVar2[(dicPos - uVar1) + local_58];
      dicPos = dicPos + 1;
    }
    p->dicPos = dicPos;
  }
  return;
}

Assistant:

static void MY_FAST_CALL LzmaDec_WriteRem(CLzmaDec *p, SizeT limit)
{
  if (p->remainLen != 0 && p->remainLen < kMatchSpecLenStart)
  {
    Byte *dic = p->dic;
    SizeT dicPos = p->dicPos;
    SizeT dicBufSize = p->dicBufSize;
    unsigned len = p->remainLen;
    SizeT rep0 = p->reps[0]; /* we use SizeT to avoid the BUG of VC14 for AMD64 */
    SizeT rem = limit - dicPos;
    if (rem < len)
      len = (unsigned)(rem);

    if (p->checkDicSize == 0 && p->prop.dicSize - p->processedPos <= len)
      p->checkDicSize = p->prop.dicSize;

    p->processedPos += len;
    p->remainLen -= len;
    while (len != 0)
    {
      len--;
      dic[dicPos] = dic[dicPos - rep0 + (dicPos < rep0 ? dicBufSize : 0)];
      dicPos++;
    }
    p->dicPos = dicPos;
  }
}